

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86compiler.cpp
# Opt level: O1

Error __thiscall
asmjit::X86Compiler::_emit
          (X86Compiler *this,uint32_t instId,Operand_ *o0,Operand_ *o1,Operand_ *o2,Operand_ *o3)

{
  ZoneHeap *this_00;
  char *__s;
  Zone *pZVar1;
  uint uVar2;
  anon_union_8_2_78723da6_for_MemData_2 aVar3;
  ushort uVar4;
  Error EVar5;
  CBJump *node;
  CBJump *pCVar6;
  CBLabel **ppCVar7;
  undefined4 extraout_var;
  char *str;
  int iVar8;
  CBJump *pCVar9;
  uint count;
  ulong unaff_R13;
  uint uVar10;
  Operand_ *pOVar12;
  uint uVar13;
  Operand_ *pOVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  Detail instDetail;
  Operand opArray [4];
  StringBuilderTmp<256UL> sb;
  Error local_1fc;
  uint local_1c0;
  Operand_ *local_1b0;
  Detail local_1a8;
  anon_union_16_7_ed616b9d_for_Operand__0 local_198;
  UInt64 local_188;
  anon_union_8_2_78723da6_for_MemData_2 aStack_180;
  UInt64 local_178;
  anon_union_8_2_78723da6_for_MemData_2 aStack_170;
  UInt64 local_168;
  anon_union_8_2_78723da6_for_MemData_2 aStack_160;
  StringBuilder local_158;
  CBLabel local_138 [4];
  Operand_ *pOVar11;
  
  uVar10 = (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._globalOptions |
           (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._options;
  pOVar11 = (Operand_ *)(ulong)uVar10;
  __s = (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._inlineComment;
  bVar16 = (undefined1  [16])((undefined1  [16])o0->field_0 & (undefined1  [16])0x7) !=
           (undefined1  [16])0x0;
  pOVar14 = (Operand_ *)(ulong)bVar16;
  uVar2 = (uint)((undefined1  [16])((undefined1  [16])o1->field_0 & (undefined1  [16])0x7) !=
                (undefined1  [16])0x0);
  EVar5 = uVar2 + bVar16;
  bVar16 = (undefined1  [16])((undefined1  [16])o2->field_0 & (undefined1  [16])0x7) !=
           (undefined1  [16])0x0;
  bVar17 = (undefined1  [16])((undefined1  [16])o3->field_0 & (undefined1  [16])0x7) !=
           (undefined1  [16])0x0;
  count = (uint)bVar16 + (uint)bVar17 + EVar5;
  if ((uVar10 & 3) != 0) {
    EVar5 = (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._lastError;
    if (EVar5 != 0) {
      return EVar5;
    }
    EVar5 = 0;
    if ((uVar10 & 2) != 0) {
      local_198._packed[0].field_10 = (o0->field_0)._packed[0];
      local_198._mem.field_2 = (o0->field_0)._mem.field_2;
      local_188 = (o1->field_0)._packed[0];
      aStack_180 = (o1->field_0)._mem.field_2;
      local_178 = (o2->field_0)._packed[0];
      aStack_170 = (o2->field_0)._mem.field_2;
      local_168 = (o3->field_0)._packed[0];
      aStack_160 = (o3->field_0)._mem.field_2;
      local_1a8.extraReg = (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraReg;
      local_1a8.instId = instId;
      local_1a8.options = uVar10;
      EVar5 = Inst::validate((uint)(this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter.
                                   _codeInfo._archInfo.field_0.field_0._type,&local_1a8,
                             (Operand_ *)&local_198._any,count);
      unaff_R13 = (ulong)EVar5;
      pOVar12 = pOVar11;
      local_1b0 = o0;
      if (EVar5 == 0) goto LAB_00170269;
      local_158._data = (char *)local_138;
      local_138[0].super_CBNode._prev._0_1_ = 0;
      local_158._length = 0;
      local_158._capacity = 0x100;
      local_158._canFree = 0;
      str = DebugUtils::errorAsString(EVar5);
      StringBuilder::_opString(&local_158,1,str,0xffffffffffffffff);
      StringBuilder::_opString(&local_158,1,": ",0xffffffffffffffff);
      Logging::formatInstruction
                (&local_158,0,(CodeEmitter *)this,
                 (uint)(this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._codeInfo.
                       _archInfo.field_0.field_0._type,&local_1a8,(Operand_ *)&local_198._any,count)
      ;
      local_1fc = CodeEmitter::setLastError((CodeEmitter *)this,EVar5,local_158._data);
      StringBuilder::~StringBuilder(&local_158);
      goto LAB_0017026d;
    }
  }
  do {
    (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._options = 0;
    (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._inlineComment = (char *)0x0;
    bVar15 = 0x1f < instId - 0x113;
    unaff_R13 = CONCAT71((int7)(unaff_R13 >> 8),bVar15);
    this_00 = &(this->super_CodeCompiler).super_CodeBuilder._cbHeap;
    pZVar1 = (this->super_CodeCompiler).super_CodeBuilder._cbHeap._zone;
    uVar10 = (uint)bVar17;
    uVar13 = (uint)pOVar11;
    local_1c0 = (uint)bVar16;
    if (bVar15 && 2 < instId - 0x176) {
      if (pZVar1 != (Zone *)0x0) {
        node = (CBJump *)ZoneHeap::_alloc(this_00,(ulong)(count * 0x10 + 0x48),(size_t *)&local_158)
        ;
        if (node == (CBJump *)0x0) goto LAB_0017024b;
        ppCVar7 = &node->_target;
        if (count != 0) {
          aVar3 = (o0->field_0)._mem.field_2;
          *ppCVar7 = (CBLabel *)(o0->field_0)._packed[0];
          node->_jumpNext = (CBJump *)aVar3;
        }
        if (1 < count) {
          aVar3 = (o1->field_0)._mem.field_2;
          node[1].super_CBInst.super_CBNode._prev = (CBNode *)(o1->field_0)._packed[0];
          node[1].super_CBInst.super_CBNode._next = (CBNode *)aVar3;
        }
        if (2 < count) {
          aVar3 = (o2->field_0)._mem.field_2;
          *(UInt64 *)&node[1].super_CBInst.super_CBNode._type = (o2->field_0)._packed[0];
          node[1].super_CBInst.super_CBNode._inlineComment = (char *)aVar3;
        }
        if (3 < count) {
          aVar3 = (o3->field_0)._mem.field_2;
          node[1].super_CBInst.super_CBNode._passData = (void *)(o3->field_0)._packed[0];
          *(anon_union_8_2_78723da6_for_MemData_2 *)&node[1].super_CBInst._instDetail = aVar3;
        }
        (node->super_CBInst).super_CBNode._prev = (CBNode *)0x0;
        (node->super_CBInst).super_CBNode._next = (CBNode *)0x0;
        (node->super_CBInst).super_CBNode._type = '\x01';
        (node->super_CBInst).super_CBNode._opCount = '\0';
        uVar4 = (ushort)(this->super_CodeCompiler).super_CodeBuilder._nodeFlags;
        (node->super_CBInst).super_CBNode._flags = uVar4;
        (node->super_CBInst).super_CBNode._position =
             (this->super_CodeCompiler).super_CodeBuilder._position;
        *(undefined1 (*) [32])&(node->super_CBInst).super_CBNode._inlineComment = ZEXT432(0) << 0x40
        ;
        (node->super_CBInst).super_CBNode._flags = uVar4 | 4;
        (node->super_CBInst)._instDetail.instId = instId & 0xffff;
        (node->super_CBInst)._instDetail.options = uVar13;
        (node->super_CBInst).super_CBNode._opCount = (uint8_t)count;
        (node->super_CBInst)._opArray = (Operand *)ppCVar7;
        if (count == 0) {
          iVar8 = 0xff;
          goto LAB_0017005e;
        }
        iVar8 = 0;
        break;
      }
    }
    else {
      if (pZVar1 != (Zone *)0x0) {
        node = (CBJump *)ZoneHeap::_alloc(this_00,(ulong)(count * 0x10 + 0x58),(size_t *)&local_158)
        ;
        if (node == (CBJump *)0x0) {
LAB_0017024b:
          EVar5 = CodeEmitter::setLastError((CodeEmitter *)this,1,(char *)0x0);
          return EVar5;
        }
        pCVar6 = node + 1;
        if (count != 0) {
          aVar3 = (o0->field_0)._mem.field_2;
          (pCVar6->super_CBInst).super_CBNode._prev = (CBNode *)(o0->field_0)._packed[0];
          node[1].super_CBInst.super_CBNode._next = (CBNode *)aVar3;
        }
        if (1 < count) {
          aVar3 = (o1->field_0)._mem.field_2;
          *(UInt64 *)&node[1].super_CBInst.super_CBNode._type = (o1->field_0)._packed[0];
          node[1].super_CBInst.super_CBNode._inlineComment = (char *)aVar3;
        }
        if (2 < count) {
          aVar3 = (o2->field_0)._mem.field_2;
          node[1].super_CBInst.super_CBNode._passData = (void *)(o2->field_0)._packed[0];
          *(anon_union_8_2_78723da6_for_MemData_2 *)&node[1].super_CBInst._instDetail = aVar3;
        }
        if (3 < count) {
          aVar3 = (o3->field_0)._mem.field_2;
          node[1].super_CBInst._instDetail.extraReg = (RegOnly)(o3->field_0)._packed[0];
          *(anon_union_8_2_78723da6_for_MemData_2 *)&node[1].super_CBInst._memOpIndex = aVar3;
        }
        (node->super_CBInst).super_CBNode._prev = (CBNode *)0x0;
        (node->super_CBInst).super_CBNode._next = (CBNode *)0x0;
        (node->super_CBInst).super_CBNode._type = '\x01';
        (node->super_CBInst).super_CBNode._opCount = '\0';
        uVar4 = (ushort)(this->super_CodeCompiler).super_CodeBuilder._nodeFlags;
        (node->super_CBInst).super_CBNode._flags = uVar4;
        (node->super_CBInst).super_CBNode._position =
             (this->super_CodeCompiler).super_CodeBuilder._position;
        (node->super_CBInst).super_CBNode._inlineComment = (char *)0x0;
        (node->super_CBInst).super_CBNode._passData = (void *)0x0;
        (node->super_CBInst)._instDetail.instId = 0;
        (node->super_CBInst)._instDetail.options = 0;
        (node->super_CBInst)._instDetail.extraReg._signature = 0;
        (node->super_CBInst)._instDetail.extraReg._id = 0;
        (node->super_CBInst).super_CBNode._flags = uVar4 | 4;
        (node->super_CBInst)._instDetail.instId = instId;
        (node->super_CBInst)._instDetail.options = uVar13;
        (node->super_CBInst).super_CBNode._opCount = (uint8_t)count;
        (node->super_CBInst)._opArray = (Operand *)pCVar6;
        if (count == 0) {
          iVar8 = 0xff;
          goto LAB_0016ffeb;
        }
        iVar8 = 0;
        pCVar9 = pCVar6;
        goto LAB_0016fec4;
      }
      _emit();
    }
    _emit();
    pOVar12 = o0;
    pOVar14 = pOVar11;
    local_1fc = EVar5;
LAB_00170269:
    uVar10 = (uint)pOVar12 & 0xfffffffd;
LAB_0017026d:
    pOVar11 = (Operand_ *)(ulong)uVar10;
    o0 = local_1b0;
    EVar5 = local_1fc;
    if ((int)unaff_R13 != 0) {
      return local_1fc;
    }
  } while( true );
  while( true ) {
    iVar8 = iVar8 + 1;
    ppCVar7 = ppCVar7 + 2;
    if (uVar10 + uVar2 + (int)pOVar14 + local_1c0 == iVar8) break;
    if (((ulong)*ppCVar7 & 7) == 2) goto LAB_0017005e;
  }
  iVar8 = 0xff;
LAB_0017005e:
  (node->super_CBInst)._memOpIndex = (uint8_t)iVar8;
  (node->super_CBInst)._instDetail.extraReg =
       (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraReg;
  (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraReg._signature = 0;
  (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraReg._id = 0;
  goto LAB_001700df;
  while( true ) {
    iVar8 = iVar8 + 1;
    pCVar9 = (CBJump *)&(pCVar9->super_CBInst).super_CBNode._type;
    if (uVar10 + uVar2 + (int)pOVar14 + local_1c0 == iVar8) break;
LAB_0016fec4:
    if (((ulong)(pCVar9->super_CBInst).super_CBNode._prev & 7) == 2) goto LAB_0016ffeb;
  }
  iVar8 = 0xff;
LAB_0016ffeb:
  (node->super_CBInst)._memOpIndex = (uint8_t)iVar8;
  node->_target = (CBLabel *)0x0;
  node->_jumpNext = (CBJump *)0x0;
  (node->super_CBInst)._instDetail.extraReg =
       (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraReg;
  (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraReg._signature = 0;
  (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraReg._id = 0;
  local_158._data = (char *)0x0;
  if (((ulong)pOVar11 & 0x10) == 0) {
    if (((ulong)(pCVar6->super_CBInst).super_CBNode._prev & 7) == 4) {
      EVar5 = CodeBuilder::getCBLabel
                        ((CodeBuilder *)this,(CBLabel **)&local_158,
                         *(uint32_t *)((long)&node[1].super_CBInst.super_CBNode._prev + 4));
      if (EVar5 != 0) {
        EVar5 = CodeEmitter::setLastError((CodeEmitter *)this,EVar5,(char *)0x0);
        return EVar5;
      }
    }
    else {
      pOVar11 = (Operand_ *)(ulong)(uVar13 | 0x10);
    }
  }
  (node->super_CBInst)._instDetail.options = (uint32_t)pOVar11;
  uVar4 = 0x50;
  if (instId != 0x11e) {
    uVar4 = 0x20;
  }
  uVar4 = uVar4 | (node->super_CBInst).super_CBNode._flags;
  (node->super_CBInst).super_CBNode._flags = uVar4;
  node->_target = (CBLabel *)local_158._data;
  node->_jumpNext = (CBJump *)0x0;
  if ((CBLabel *)local_158._data != (CBLabel *)0x0) {
    node->_jumpNext = *(CBJump **)((long)local_158._data + 0x30);
    *(CBJump **)((long)local_158._data + 0x30) = node;
    *(uint32_t *)((long)local_158._data + 0x2c) = *(uint32_t *)((long)local_158._data + 0x2c) + 1;
  }
  if ((instId == 0x11e) || (((ulong)pOVar11 & 0x100) != 0)) {
    (node->super_CBInst).super_CBNode._flags = uVar4 | 0x40;
  }
LAB_001700df:
  if (__s != (char *)0x0) {
    strlen(__s);
    iVar8 = Zone::dup(&(this->super_CodeCompiler).super_CodeBuilder._cbDataZone,(int)__s);
    (node->super_CBInst).super_CBNode._inlineComment = (char *)CONCAT44(extraout_var,iVar8);
  }
  CodeBuilder::addNode((CodeBuilder *)this,(CBNode *)node);
  return 0;
}

Assistant:

Error X86Compiler::_emit(uint32_t instId, const Operand_& o0, const Operand_& o1, const Operand_& o2, const Operand_& o3) {
  uint32_t options = getOptions() | getGlobalOptions();
  const char* inlineComment = getInlineComment();

  uint32_t opCount = static_cast<uint32_t>(!o0.isNone()) +
                     static_cast<uint32_t>(!o1.isNone()) +
                     static_cast<uint32_t>(!o2.isNone()) +
                     static_cast<uint32_t>(!o3.isNone()) ;

  // Handle failure and rare cases first.
  const uint32_t kErrorsAndSpecialCases = kOptionMaybeFailureCase | // CodeEmitter is in error state.
                                          kOptionStrictValidation ; // Strict validation.

  if (ASMJIT_UNLIKELY(options & kErrorsAndSpecialCases)) {
    // Don't do anything if we are in error state.
    if (_lastError) return _lastError;

#if !defined(ASMJIT_DISABLE_VALIDATION)
    // Strict validation.
    if (options & kOptionStrictValidation) {
      Operand opArray[] = {
        Operand(o0),
        Operand(o1),
        Operand(o2),
        Operand(o3)
      };

      Inst::Detail instDetail(instId, options, _extraReg);
      Error err = Inst::validate(getArchType(), instDetail, opArray, opCount);

      if (err) {
#if !defined(ASMJIT_DISABLE_LOGGING)
        StringBuilderTmp<256> sb;
        sb.appendString(DebugUtils::errorAsString(err));
        sb.appendString(": ");
        Logging::formatInstruction(sb, 0, this, getArchType(), instDetail, opArray, opCount);
        return setLastError(err, sb.getData());
#else
        return setLastError(err);
#endif
      }

      // Clear it as it must be enabled explicitly on assembler side.
      options &= ~kOptionStrictValidation;
    }
#endif // ASMJIT_DISABLE_VALIDATION
  }

  resetOptions();
  resetInlineComment();

  // decide between `CBInst` and `CBJump`.
  if (isJumpInst(instId)) {
    CBJump* node = _cbHeap.allocT<CBJump>(sizeof(CBJump) + opCount * sizeof(Operand));
    Operand* opArray = reinterpret_cast<Operand*>(reinterpret_cast<uint8_t*>(node) + sizeof(CBJump));

    if (ASMJIT_UNLIKELY(!node))
      return setLastError(DebugUtils::errored(kErrorNoHeapMemory));

    if (opCount > 0) opArray[0].copyFrom(o0);
    if (opCount > 1) opArray[1].copyFrom(o1);
    if (opCount > 2) opArray[2].copyFrom(o2);
    if (opCount > 3) opArray[3].copyFrom(o3);

    new(node) CBJump(this, instId, options, opArray, opCount);
    node->_instDetail.extraReg = _extraReg;
    _extraReg.reset();

    CBLabel* jTarget = nullptr;
    if (!(options & kOptionUnfollow)) {
      if (opArray[0].isLabel()) {
        Error err = getCBLabel(&jTarget, static_cast<Label&>(opArray[0]));
        if (err) return setLastError(err);
      }
      else {
        options |= kOptionUnfollow;
      }
    }
    node->setOptions(options);

    node->orFlags(instId == X86Inst::kIdJmp ? CBNode::kFlagIsJmp | CBNode::kFlagIsTaken : CBNode::kFlagIsJcc);
    node->_target = jTarget;
    node->_jumpNext = nullptr;

    if (jTarget) {
      node->_jumpNext = static_cast<CBJump*>(jTarget->_from);
      jTarget->_from = node;
      jTarget->addNumRefs();
    }

    // The 'jmp' is always taken, conditional jump can contain hint, we detect it.
    if (instId == X86Inst::kIdJmp)
      node->orFlags(CBNode::kFlagIsTaken);
    else if (options & X86Inst::kOptionTaken)
      node->orFlags(CBNode::kFlagIsTaken);

    if (inlineComment) {
      inlineComment = static_cast<char*>(_cbDataZone.dup(inlineComment, ::strlen(inlineComment), true));
      node->setInlineComment(inlineComment);
    }

    addNode(node);
    return kErrorOk;
  }
  else {
    CBInst* node = _cbHeap.allocT<CBInst>(sizeof(CBInst) + opCount * sizeof(Operand));
    Operand* opArray = reinterpret_cast<Operand*>(reinterpret_cast<uint8_t*>(node) + sizeof(CBInst));

    if (ASMJIT_UNLIKELY(!node))
      return setLastError(DebugUtils::errored(kErrorNoHeapMemory));

    if (opCount > 0) opArray[0].copyFrom(o0);
    if (opCount > 1) opArray[1].copyFrom(o1);
    if (opCount > 2) opArray[2].copyFrom(o2);
    if (opCount > 3) opArray[3].copyFrom(o3);

    node = new(node) CBInst(this, instId, options, opArray, opCount);
    node->_instDetail.extraReg = _extraReg;
    _extraReg.reset();

    if (inlineComment) {
      inlineComment = static_cast<char*>(_cbDataZone.dup(inlineComment, ::strlen(inlineComment), true));
      node->setInlineComment(inlineComment);
    }

    addNode(node);
    return kErrorOk;
  }
}